

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.cc
# Opt level: O3

int __thiscall
wabt::string_view::compare(string_view *this,size_type pos1,size_type n1,string_view s)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = s.size_;
  uVar3 = this->size_ - pos1;
  if (this->size_ < pos1) {
    __assert_fail("pos <= size_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/string-view.cc"
                  ,0x3e,"string_view wabt::string_view::substr(size_type, size_type) const");
  }
  if (uVar3 < n1) {
    n1 = uVar3;
  }
  uVar3 = uVar4;
  if (n1 < uVar4) {
    uVar3 = n1;
  }
  if ((uVar3 != 0) && (iVar1 = memcmp(this->data_ + pos1,s.data_,uVar3), iVar1 != 0)) {
    return iVar1;
  }
  uVar2 = 0;
  if (n1 != uVar4) {
    uVar2 = -(uint)(n1 < uVar4) | 1;
  }
  return uVar2;
}

Assistant:

string_view string_view::substr(size_type pos, size_type n) const {
  assert(pos <= size_);
  size_t count = std::min(n, size_ - pos);
  return string_view(data_ + pos, count);
}